

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

int __thiscall
Centaurus::Grammar<unsigned_char>::parse
          (Grammar<unsigned_char> *this,string *filename,int machine_id)

{
  int iVar1;
  
  iVar1 = parse(this,(filename->_M_dataplus)._M_p,machine_id);
  return iVar1;
}

Assistant:

ATNMachine(int id, Stream& stream)
        : m_globalid(id)
    {
        parse(stream);
    }